

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-create.c
# Opt level: O2

_Bool cn_cbor_array_append(cn_cbor *cb_array,cn_cbor *cb_value,cn_cbor_errback *errp)

{
  cn_cbor **ppcVar1;
  
  if ((cb_value != (cn_cbor *)0x0 && cb_array != (cn_cbor *)0x0) &&
     (cb_array->type == CN_CBOR_ARRAY)) {
    cb_value->parent = cb_array;
    cb_value->next = (cn_cbor *)0x0;
    ppcVar1 = &cb_array->last_child->next;
    if (cb_array->last_child == (cn_cbor *)0x0) {
      ppcVar1 = &cb_array->first_child;
    }
    *ppcVar1 = cb_value;
    cb_array->last_child = cb_value;
    cb_array->length = cb_array->length + 1;
    return true;
  }
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
  }
  return false;
}

Assistant:

MYLIB_EXPORT
bool cn_cbor_array_append(cn_cbor* cb_array,
                          cn_cbor* cb_value,
                          cn_cbor_errback *errp)
{
  //Make sure input is an array.
  if(!cb_array || !cb_value || cb_array->type != CN_CBOR_ARRAY)
  {
    if (errp) {errp->err = CN_CBOR_ERR_INVALID_PARAMETER;}
    return false;
  }

  cb_value->parent = cb_array;
  cb_value->next = NULL;
  if(cb_array->last_child) {
    cb_array->last_child->next = cb_value;
  } else {
    cb_array->first_child = cb_value;
  }
  cb_array->last_child = cb_value;
  cb_array->length++;
  return true;
}